

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_GetProperty
              (Var instance,PropertyId propertyId,ScriptContext *scriptContext)

{
  code *pcVar1;
  RecyclableObject *scriptContext_00;
  bool bVar2;
  BOOL BVar3;
  ThreadContext *this;
  PropertyRecord *this_00;
  char16 *varName;
  JavascriptLibrary *this_01;
  Var pvVar4;
  undefined4 *puVar5;
  Var result;
  RecyclableObject *object;
  ScriptContext *scriptContext_local;
  Var pvStack_18;
  PropertyId propertyId_local;
  Var instance_local;
  
  result = (Var)0x0;
  object = (RecyclableObject *)scriptContext;
  scriptContext_local._4_4_ = propertyId;
  pvStack_18 = instance;
  BVar3 = GetPropertyObject(instance,scriptContext,(RecyclableObject **)&result);
  if (BVar3 == 0) {
    this = ScriptContext::GetThreadContext((ScriptContext *)object);
    bVar2 = ThreadContext::RecordImplicitException(this);
    scriptContext_00 = object;
    if (bVar2) {
      this_00 = ScriptContext::GetPropertyName((ScriptContext *)object,scriptContext_local._4_4_);
      varName = PropertyRecord::GetBuffer(this_00);
      JavascriptError::ThrowTypeError((ScriptContext *)scriptContext_00,-0x7ff5ec48,varName);
    }
    this_01 = ScriptContext::GetLibrary((ScriptContext *)object);
    instance_local = JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
  }
  else {
    pvVar4 = GetPropertyNoCache(pvStack_18,(RecyclableObject *)result,scriptContext_local._4_4_,
                                (ScriptContext *)object);
    instance_local = pvVar4;
    if (pvVar4 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x875,"(result != nullptr)","result null in OP_GetProperty");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  return instance_local;
}

Assistant:

Var JavascriptOperators::OP_GetProperty(Var instance, PropertyId propertyId, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_GetProperty);
        RecyclableObject* object = nullptr;
        if (FALSE == JavascriptOperators::GetPropertyObject(instance, scriptContext, &object))
        {
            if (scriptContext->GetThreadContext()->RecordImplicitException())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotGet_NullOrUndefined, scriptContext->GetPropertyName(propertyId)->GetBuffer());
            }
            else
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
        }

        Var result = JavascriptOperators::GetPropertyNoCache(instance, object, propertyId, scriptContext);
        AssertMsg(result != nullptr, "result null in OP_GetProperty");
        return result;
        JIT_HELPER_END(Op_GetProperty);
    }